

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmn.c
# Opt level: O1

int jsmn_parse(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,uint num_tokens)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  jsmntok_t *pjVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int local_44;
  
  uVar11 = parser->toknext;
  if (len <= parser->pos) {
LAB_001054eb:
    if ((tokens != (jsmntok_t *)0x0) && (uVar13 = parser->toknext - 1, -1 < (int)uVar13)) {
      piVar10 = &tokens[uVar13].end;
      lVar8 = (ulong)uVar13 + 1;
      do {
        if ((piVar10[-1] != -1) && (*piVar10 == -1)) {
          return -3;
        }
        piVar10 = piVar10 + -4;
        lVar9 = lVar8 + -1;
        bVar3 = 0 < lVar8;
        lVar8 = lVar9;
      } while (lVar9 != 0 && bVar3);
    }
    return uVar11;
  }
  uVar6 = (ulong)parser->pos;
LAB_00104fd9:
  bVar1 = js[uVar6];
  bVar3 = true;
  uVar13 = (uint)uVar6;
  if (0x2b < bVar1) {
    if (bVar1 < 0x5d) {
      if (bVar1 == 0x2c) {
        if ((((tokens != (jsmntok_t *)0x0) && ((long)parser->toksuper != -1)) &&
            (1 < tokens[parser->toksuper].type - JSMN_OBJECT)) &&
           (uVar12 = parser->toknext - 1, -1 < (int)uVar12)) {
          piVar10 = &tokens[uVar12].end;
          uVar6 = (ulong)uVar12;
          do {
            if (((((jsmntok_t *)(piVar10 + -2))->type - JSMN_OBJECT < 2) && (piVar10[-1] != -1)) &&
               (*piVar10 == -1)) goto LAB_001054b9;
            piVar10 = piVar10 + -4;
            bVar4 = 0 < (long)uVar6;
            uVar6 = uVar6 - 1;
          } while (bVar4);
        }
      }
      else {
        if (bVar1 != 0x3a) {
          if (bVar1 != 0x5b) goto LAB_00105276;
LAB_001052ed:
          uVar11 = uVar11 + 1;
          if (tokens == (jsmntok_t *)0x0) goto LAB_001054d4;
          uVar12 = parser->toknext;
          if (uVar12 < num_tokens) {
            parser->toknext = uVar12 + 1;
            pjVar5 = tokens + uVar12;
            tokens[uVar12].start = -1;
            tokens[uVar12].end = -1;
            tokens[uVar12].size = 0;
          }
          else {
            pjVar5 = (jsmntok_t *)0x0;
          }
          if (pjVar5 == (jsmntok_t *)0x0) {
            local_44 = -1;
            goto LAB_00105456;
          }
          if ((long)parser->toksuper != -1) {
            tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
          }
          pjVar5->type = (bVar1 != 0x7b) + JSMN_OBJECT;
          pjVar5->start = uVar13;
        }
        parser->toksuper = parser->toknext - 1;
      }
    }
    else {
      if (bVar1 != 0x5d) {
        if (bVar1 == 0x7b) goto LAB_001052ed;
        if (bVar1 != 0x7d) goto LAB_00105276;
      }
      if (tokens != (jsmntok_t *)0x0) {
        uVar6 = (ulong)parser->toknext;
        uVar12 = parser->toknext - 1;
        if (-1 < (int)uVar12) {
          piVar10 = &tokens[uVar12].end;
          uVar6 = (ulong)uVar12 + 1;
          do {
            if ((piVar10[-1] != -1) && (*piVar10 == -1)) {
              if (((jsmntok_t *)(piVar10 + -2))->type != (bVar1 != 0x7d) + JSMN_OBJECT)
              goto LAB_0010544e;
              uVar12 = (int)uVar6 - 1;
              parser->toksuper = -1;
              *piVar10 = uVar13 + 1;
              goto LAB_0010540c;
            }
            piVar10 = piVar10 + -4;
            uVar7 = uVar6 - 1;
            bVar4 = 0 < (long)uVar6;
            uVar6 = uVar7;
          } while (uVar7 != 0 && bVar4);
          uVar6 = 0;
          uVar12 = 0xffffffff;
        }
LAB_0010540c:
        if ((int)uVar6 == 0) {
LAB_0010544e:
          local_44 = -2;
LAB_00105456:
          bVar3 = false;
        }
        else if (-1 < (int)uVar12) {
          piVar10 = &tokens[uVar12].end;
          uVar6 = (ulong)uVar12;
          do {
            if ((piVar10[-1] != -1) && (*piVar10 == -1)) goto LAB_001054b9;
            piVar10 = piVar10 + -4;
            bVar4 = 0 < (long)uVar6;
            uVar6 = uVar6 - 1;
          } while (bVar4);
        }
      }
    }
    goto LAB_001054d4;
  }
  if (bVar1 < 0xd) {
    if (bVar1 - 9 < 2) goto LAB_001054d4;
    if (bVar1 == 0) goto LAB_001054eb;
LAB_00105276:
    do {
      bVar1 = js[uVar6];
      if ((((ulong)bVar1 < 0x3b) && ((0x400100100002601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
         ((bVar1 == 0x5d || (bVar1 == 0x7d)))) break;
      if ((byte)(bVar1 + 0x81) < 0xa1) {
        iVar16 = -2;
        goto LAB_001054c3;
      }
      uVar12 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar12;
      parser->pos = uVar12;
    } while (uVar6 < len);
    if (tokens == (jsmntok_t *)0x0) {
LAB_00105479:
      uVar13 = (int)uVar6 - 1;
      bVar4 = false;
      iVar16 = 0;
    }
    else {
      uVar12 = parser->toknext;
      if (uVar12 < num_tokens) {
        parser->toknext = uVar12 + 1;
        pjVar5 = tokens + uVar12;
        tokens[uVar12].start = -1;
        tokens[uVar12].end = -1;
        tokens[uVar12].size = 0;
      }
      else {
        pjVar5 = (jsmntok_t *)0x0;
      }
      if (pjVar5 != (jsmntok_t *)0x0) {
        pjVar5->type = JSMN_PRIMITIVE;
        pjVar5->start = uVar13;
        pjVar5->end = (int)uVar6;
        pjVar5->size = 0;
        goto LAB_00105479;
      }
      iVar16 = -1;
LAB_001054c3:
      bVar4 = true;
    }
    parser->pos = uVar13;
    if (!bVar4) {
LAB_0010548d:
      uVar11 = uVar11 + 1;
      if ((long)parser->toksuper != -1 && tokens != (jsmntok_t *)0x0) {
        tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
      }
      goto LAB_001054d4;
    }
  }
  else {
    if ((bVar1 == 0xd) || (bVar1 == 0x20)) goto LAB_001054d4;
    if (bVar1 != 0x22) goto LAB_00105276;
    uVar12 = uVar13 + 1;
    parser->pos = uVar12;
    if (uVar12 < len) {
      uVar7 = (ulong)uVar12;
      do {
        cVar2 = js[uVar7];
        uVar14 = (uint)uVar7;
        if (cVar2 == '\"') {
          if (tokens != (jsmntok_t *)0x0) {
            uVar15 = parser->toknext;
            if (uVar15 < num_tokens) {
              parser->toknext = uVar15 + 1;
              pjVar5 = tokens + uVar15;
              tokens[uVar15].start = -1;
              tokens[uVar15].end = -1;
              tokens[uVar15].size = 0;
            }
            else {
              pjVar5 = (jsmntok_t *)0x0;
            }
            if (pjVar5 == (jsmntok_t *)0x0) {
              parser->pos = uVar13;
              uVar6 = 0xffffffff;
LAB_0010518c:
              bVar4 = false;
              uVar14 = uVar13;
              goto LAB_001051b0;
            }
            pjVar5->type = JSMN_STRING;
            pjVar5->start = uVar12;
            pjVar5->end = uVar14;
            pjVar5->size = 0;
          }
          uVar6 = 0;
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (cVar2 == '\\') {
            uVar15 = uVar14 + 1;
            if (uVar15 < len) {
              parser->pos = uVar15;
              bVar1 = js[uVar15];
              if ((bVar1 - 0x2f < 0x38) &&
                 ((0x88200000000001U >> ((ulong)(bVar1 - 0x2f) & 0x3f) & 1) != 0)) {
switchD_001050ca_caseD_6e:
                uVar14 = uVar15;
              }
              else {
                switch(bVar1) {
                case 0x6e:
                case 0x72:
                case 0x74:
                  goto switchD_001050ca_caseD_6e;
                case 0x6f:
                case 0x70:
                case 0x71:
                case 0x73:
switchD_001050ca_caseD_6f:
                  parser->pos = uVar13;
                  uVar6 = 0xfffffffe;
                  goto LAB_0010518c;
                case 0x75:
                  uVar14 = uVar14 + 2;
                  parser->pos = uVar14;
                  iVar16 = 4;
                  do {
                    if ((len <= uVar14) || (bVar1 = js[uVar14], bVar1 == 0)) break;
                    if ((9 < (byte)(bVar1 - 0x30)) &&
                       ((0x25 < bVar1 - 0x41 ||
                        ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0))))
                    goto switchD_001050ca_caseD_6f;
                    uVar14 = uVar14 + 1;
                    parser->pos = uVar14;
                    iVar16 = iVar16 + -1;
                  } while (iVar16 != 0);
                  uVar14 = uVar14 - 1;
                  parser->pos = uVar14;
                  break;
                default:
                  uVar14 = uVar15;
                  if (bVar1 != 0x22) goto switchD_001050ca_caseD_6f;
                }
              }
            }
          }
          else if (cVar2 == '\0') break;
        }
LAB_001051b0:
        iVar16 = (int)uVar6;
        if (!bVar4) goto LAB_00105489;
        uVar7 = (ulong)(uVar14 + 1);
        parser->pos = uVar14 + 1;
      } while (uVar7 < len);
    }
    parser->pos = uVar13;
    iVar16 = -3;
    uVar14 = uVar13;
LAB_00105489:
    uVar13 = uVar14;
    if (-1 < iVar16) goto LAB_0010548d;
  }
  bVar3 = false;
  local_44 = iVar16;
LAB_001054d4:
  if (!bVar3) {
    return local_44;
  }
  uVar6 = (ulong)(uVar13 + 1);
  parser->pos = uVar13 + 1;
  if (len <= uVar6) goto LAB_001054eb;
  goto LAB_00104fd9;
LAB_001054b9:
  parser->toksuper = (int)uVar6;
  goto LAB_001054d4;
}

Assistant:

int jsmn_parse(jsmn_parser *parser, const char *js, size_t len,
		jsmntok_t *tokens, unsigned int num_tokens) {
	int r;
	int i;
	jsmntok_t *token;
	int count = parser->toknext;

	for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
		char c;
		jsmntype_t type;

		c = js[parser->pos];
		switch (c) {
			case '{': case '[':
				count++;
				if (tokens == NULL) {
					break;
				}
				token = jsmn_alloc_token(parser, tokens, num_tokens);
				if (token == NULL)
					return JSMN_ERROR_NOMEM;
				if (parser->toksuper != -1) {
					tokens[parser->toksuper].size++;
#ifdef JSMN_PARENT_LINKS
					token->parent = parser->toksuper;
#endif
				}
				token->type = (c == '{' ? JSMN_OBJECT : JSMN_ARRAY);
				token->start = parser->pos;
				parser->toksuper = parser->toknext - 1;
				break;
			case '}': case ']':
				if (tokens == NULL)
					break;
				type = (c == '}' ? JSMN_OBJECT : JSMN_ARRAY);
#ifdef JSMN_PARENT_LINKS
				if (parser->toknext < 1) {
					return JSMN_ERROR_INVAL;
				}
				token = &tokens[parser->toknext - 1];
				for (;;) {
					if (token->start != -1 && token->end == -1) {
						if (token->type != type) {
							return JSMN_ERROR_INVAL;
						}
						token->end = parser->pos + 1;
						parser->toksuper = token->parent;
						break;
					}
					if (token->parent == -1) {
						break;
					}
					token = &tokens[token->parent];
				}
#else
				for (i = parser->toknext - 1; i >= 0; i--) {
					token = &tokens[i];
					if (token->start != -1 && token->end == -1) {
						if (token->type != type) {
							return JSMN_ERROR_INVAL;
						}
						parser->toksuper = -1;
						token->end = parser->pos + 1;
						break;
					}
				}
				/* Error if unmatched closing bracket */
				if (i == -1) return JSMN_ERROR_INVAL;
				for (; i >= 0; i--) {
					token = &tokens[i];
					if (token->start != -1 && token->end == -1) {
						parser->toksuper = i;
						break;
					}
				}
#endif
				break;
			case '\"':
				r = jsmn_parse_string(parser, js, len, tokens, num_tokens);
				if (r < 0) return r;
				count++;
				if (parser->toksuper != -1 && tokens != NULL)
					tokens[parser->toksuper].size++;
				break;
			case '\t' : case '\r' : case '\n' : case ' ':
				break;
			case ':':
				parser->toksuper = parser->toknext - 1;
				break;
			case ',':
				if (tokens != NULL && parser->toksuper != -1 &&
						tokens[parser->toksuper].type != JSMN_ARRAY &&
						tokens[parser->toksuper].type != JSMN_OBJECT) {
#ifdef JSMN_PARENT_LINKS
					parser->toksuper = tokens[parser->toksuper].parent;
#else
					for (i = parser->toknext - 1; i >= 0; i--) {
						if (tokens[i].type == JSMN_ARRAY || tokens[i].type == JSMN_OBJECT) {
							if (tokens[i].start != -1 && tokens[i].end == -1) {
								parser->toksuper = i;
								break;
							}
						}
					}
#endif
				}
				break;
#ifdef JSMN_STRICT
			/* In strict mode primitives are: numbers and booleans */
			case '-': case '0': case '1' : case '2': case '3' : case '4':
			case '5': case '6': case '7' : case '8': case '9':
			case 't': case 'f': case 'n' :
				/* And they must not be keys of the object */
				if (tokens != NULL && parser->toksuper != -1) {
					jsmntok_t *t = &tokens[parser->toksuper];
					if (t->type == JSMN_OBJECT ||
							(t->type == JSMN_STRING && t->size != 0)) {
						return JSMN_ERROR_INVAL;
					}
				}
#else
			/* In non-strict mode every unquoted value is a primitive */
			default:
#endif
				r = jsmn_parse_primitive(parser, js, len, tokens, num_tokens);
				if (r < 0) return r;
				count++;
				if (parser->toksuper != -1 && tokens != NULL)
					tokens[parser->toksuper].size++;
				break;

#ifdef JSMN_STRICT
			/* Unexpected char in strict mode */
			default:
				return JSMN_ERROR_INVAL;
#endif
		}
	}

	if (tokens != NULL) {
		for (i = parser->toknext - 1; i >= 0; i--) {
			/* Unmatched opened object or array */
			if (tokens[i].start != -1 && tokens[i].end == -1) {
				return JSMN_ERROR_PART;
			}
		}
	}

	return count;
}